

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int proxy_conn_process(proxy_conn_handle *pc)

{
  undefined8 *puVar1;
  proxy_handle *ph;
  char *pcVar2;
  int ret;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc_local;
  
  puVar1 = (undefined8 *)pc->priv;
  pc_local._4_4_ = conn_recv((conn_handle *)*puVar1,(uint8_t *)(puVar1 + 0x1b),9);
  if (pc_local._4_4_ < 0) {
    if ((((pc_local._4_4_ != -0x6b) && (pc_local._4_4_ != -0x68)) && (pc_local._4_4_ != -0x20)) &&
       (pc_local._4_4_ != -4)) {
      ph = pc->ph;
      pcVar2 = strerror(-pc_local._4_4_);
      proxy_log(ph,LOG_LEVEL_ERROR,"Failed to receive data from client \'%s\' (%d): %s\n",
                puVar1 + 0x21b,(ulong)(uint)-pc_local._4_4_,pcVar2);
    }
  }
  else {
    pc_local._4_4_ = process_message(pc,(proxy_msg *)(puVar1 + 0x1b));
  }
  return pc_local._4_4_;
}

Assistant:

int proxy_conn_process(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret;

	ret = conn_recv(priv->conn_client, priv->buff, sizeof(struct proxy_msg));
	if (ret < 0) {
		switch (ret) {
		case -ECONNRESET:
		case -EINTR:
		case -ENOTCONN:
		case -EPIPE:
			break;
		default:
			proxy_log(pc->ph, LOG_LEVEL_ERROR,
				  "Failed to receive data from client '%s' (%d): %s\n",
				  priv->callsign, -ret, strerror(-ret));
			break;
		}

		return ret;
	}

	return process_message(pc, (struct proxy_msg *)priv->buff);
}